

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  undefined8 uVar4;
  deUint32 dVar5;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  size_t sVar10;
  deUint64 *pdVar11;
  long *plVar12;
  long lVar13;
  size_type __n;
  ulong uVar14;
  Environment env;
  Resources res;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  VkAllocationCallbacks *pVStack_2d0;
  VkComponentMapping *local_2c0;
  undefined1 local_2b8 [16];
  VkDevice local_2a8;
  VkAllocationCallbacks *pVStack_2a0;
  ProgramCollection<vk::ProgramBinary> *local_298;
  VkAllocationCallbacks *local_290;
  deUint32 local_288;
  undefined1 local_278 [40];
  VkAllocationCallbacks *local_250;
  Handle<(vk::HandleType)7> local_248;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_240;
  undefined1 local_228 [16];
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_218;
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> local_200;
  Move<vk::Handle<(vk::HandleType)13>_> local_1d8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8;
  VkAllocationCallbacks *local_178;
  size_t sStack_170;
  deUint32 local_168;
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  local_298 = context->m_progCollection;
  pVStack_2a0 = (VkAllocationCallbacks *)CONCAT44(pVStack_2a0._4_4_,dVar5);
  local_288 = 1;
  local_2b8._0_8_ = pPVar2;
  local_2b8._8_8_ = pDVar6;
  local_2a8 = pVVar7;
  local_290 = &local_1a8;
  ImageView::Resources::Resources((Resources *)local_278,(Environment *)local_2b8,&params);
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_228._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_228._8_8_ = (PFN_vkReallocationFunction)0x0;
  DStack_218.m_deviceIface = (DeviceInterface *)((ulong)DStack_218.m_deviceIface._4_4_ << 0x20);
  DStack_218.m_device = (VkDevice)local_278._8_8_;
  DStack_218.m_allocator = (VkAllocationCallbacks *)CONCAT44(params.format,params.viewType);
  local_200._0_4_ = params.components.r;
  local_200._4_4_ = params.components.g;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_ =
       params.components.b;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_ =
       params.components.a;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                m_allocator._4_4_,params.subresourceRange.layerCount);
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)params.subresourceRange._0_8_;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)params.subresourceRange._8_8_;
  ::vk::createImageView
            (&local_1d8,(DeviceInterface *)local_2b8._8_8_,local_2a8,
             (VkImageViewCreateInfo *)local_228,local_290);
  local_2e8._0_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_2e8._8_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_2d8 = (pointer)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_device;
  pVStack_2d0 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  sVar9 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_2e8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_2e8 + 8),
               (VkImageView)local_2e8._0_8_);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&DStack_240,(VkDeviceMemory)local_248.m_internal);
  }
  DStack_240.m_device = (VkDevice)0x0;
  DStack_240.m_allocator = (VkAllocationCallbacks *)0x0;
  local_248.m_internal = 0;
  DStack_240.m_deviceIface = (DeviceInterface *)0x0;
  if (local_278._8_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_278 + 0x10),
               (VkImage)local_278._8_8_);
  }
  local_278._24_8_ = (VkDevice)0x0;
  local_278._32_8_ = (VkAllocationCallbacks *)0x0;
  local_278._8_8_ = 0;
  local_278._16_8_ = (VkDevice)0x0;
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar8 = getSafeObjectCount(context,sVar9 - sVar8,0);
  __n = 0x4000;
  if (sVar8 < 0x4000) {
    __n = sVar8;
  }
  local_278._0_8_ = context->m_platformInterface;
  local_278._8_8_ = Context::getDeviceInterface(context);
  local_278._16_8_ = Context::getDevice(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  local_278._24_4_ = dVar5;
  local_278._32_8_ = context->m_progCollection;
  local_250 = (VkAllocationCallbacks *)0x0;
  local_248.m_internal._0_4_ = (int)__n;
  ImageView::Resources::Resources((Resources *)local_228,(Environment *)local_278,&params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)local_2e8,__n,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)13>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)local_1a8.pUserData + -0x18) + (int)&local_1a8);
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar8 != 0) {
    local_2c0 = &params.components;
    lVar13 = 8;
    uVar14 = 0;
    do {
      pdVar11 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0xf;
      local_1a8.pUserData = (void *)0x0;
      local_1a8.pfnAllocation._0_4_ = 0;
      local_1a8.pfnReallocation = (PFN_vkReallocationFunction)local_228._8_8_;
      local_1a8.pfnFree._0_4_ = params.viewType;
      local_1a8.pfnFree._4_4_ = params.format;
      local_1a8.pfnInternalAllocation = *(PFN_vkInternalAllocationNotification *)local_2c0;
      local_1a8.pfnInternalFree = *(PFN_vkInternalFreeNotification *)&local_2c0->b;
      local_168 = params.subresourceRange.layerCount;
      local_178 = (VkAllocationCallbacks *)params.subresourceRange._0_8_;
      sStack_170._0_4_ = params.subresourceRange.levelCount;
      sStack_170._4_4_ = params.subresourceRange.baseArrayLayer;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_2b8,
                 (DeviceInterface *)local_278._8_8_,(VkDevice)local_278._16_8_,
                 (VkImageViewCreateInfo *)local_1b0,local_250);
      pdVar11[2] = (deUint64)local_2a8;
      pdVar11[3] = (deUint64)pVStack_2a0;
      *pdVar11 = local_2b8._0_8_;
      pdVar11[1] = local_2b8._8_8_;
      local_2b8._0_8_ = (PlatformInterface *)0x0;
      local_2b8._8_8_ = (DeviceInterface *)0x0;
      local_2a8 = (VkDevice)0x0;
      pVStack_2a0 = (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      uVar4 = local_2e8._0_8_;
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00d1de90;
      plVar12[2] = (long)pdVar11;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)local_2e8._0_8_ + lVar13
                         );
      if (plVar3 != plVar12) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)(local_2e8._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)
                                           local_2e8._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar4 +
                                    lVar13) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar4 + lVar13);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar4 + lVar13) = 0;
          }
        }
        *(deUint64 **)(uVar4 + lVar13 + -8) = pdVar11;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar4 + lVar13) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar4 + lVar13)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar12 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      LOCK();
      piVar1 = (int *)((long)plVar12 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if (local_2b8._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_2b8 + 8),
                   (VkImageView)local_2b8._0_8_);
      }
      if ((uVar14 & 0x3ff) == 0 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     *)local_2e8,(pointer)local_2e8._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8.pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8.pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8.pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8.pfnAllocation._4_4_,
                             (VkImageViewCreateFlags)local_1a8.pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)local_2e8);
  if (local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_200.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_228._8_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_218,(VkImage)local_228._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}